

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitDrop
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Drop *curr,
          optional<unsigned_int> arity)

{
  bool bVar1;
  uint *puVar2;
  Expression **childp;
  size_t local_28;
  Drop *local_20;
  Drop *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<unsigned_int> arity_local;
  
  local_20 = curr;
  curr_local = (Drop *)this;
  this_local = (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)
               arity.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (!bVar1) {
    local_28 = wasm::Type::size(&local_20->value->type);
    std::optional<unsigned_int>::operator=((optional<unsigned_int> *)&this_local,&local_28);
  }
  puVar2 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&this_local);
  if (*puVar2 < 2) {
    noteAny(this,&local_20->value);
  }
  else {
    childp = &local_20->value;
    puVar2 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&this_local);
    noteAnyTuple(this,childp,(ulong)*puVar2);
  }
  return;
}

Assistant:

void visitDrop(Drop* curr, std::optional<Index> arity = std::nullopt) {
    if (!arity) {
      arity = curr->value->type.size();
    }
    if (*arity > 1) {
      noteAnyTuple(&curr->value, *arity);
    } else {
      noteAny(&curr->value);
    }
  }